

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprLexer.cxx
# Opt level: O3

yy_state_type yy_get_previous_state(yyscan_t yyscanner)

{
  short *psVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                            *(long *)((long)yyscanner + 0x18) * 8) + 0x28) +
          *(int *)((long)yyscanner + 0x4c);
  pbVar3 = *(byte **)((long)yyscanner + 0x80);
  if (pbVar3 < *(byte **)((long)yyscanner + 0x40)) {
    do {
      if ((ulong)*pbVar3 == 0) {
        bVar4 = 1;
      }
      else {
        bVar4 = ""[*pbVar3];
      }
      lVar7 = (long)iVar2;
      if (yy_accept[lVar7] != 0) {
        *(int *)((long)yyscanner + 0x68) = iVar2;
        *(byte **)((long)yyscanner + 0x70) = pbVar3;
      }
      uVar5 = (ulong)bVar4;
      lVar6 = (long)yy_base[lVar7] + uVar5;
      if (iVar2 != yy_chk[lVar6]) {
        do {
          psVar1 = yy_def + lVar7;
          lVar7 = (long)*psVar1;
          if (0xd1 < lVar7) {
            bVar4 = ""[uVar5];
          }
          uVar5 = (ulong)bVar4;
          lVar6 = (long)yy_base[lVar7] + uVar5;
        } while (*psVar1 != yy_chk[lVar6]);
      }
      iVar2 = (int)yy_nxt[lVar6];
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != *(byte **)((long)yyscanner + 0x40));
  }
  return iVar2;
}

Assistant:

static yy_state_type yy_get_previous_state (yyscan_t yyscanner)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	yy_current_state = yyg->yy_start;

	for ( yy_cp = yyg->yytext_ptr + YY_MORE_ADJ; yy_cp < yyg->yy_c_buf_p; ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			yyg->yy_last_accepting_state = yy_current_state;
			yyg->yy_last_accepting_cpos = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 29 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}